

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux.c
# Opt level: O1

int uv_fs_event_start(uv_fs_event_t *handle,uv_fs_event_cb cb,char *path,uint flags)

{
  uv_loop_t *loop_00;
  int wd_00;
  int *piVar1;
  size_t sVar2;
  watcher_root *head;
  int wd;
  int err;
  int events;
  size_t len;
  uv_loop_t *loop;
  watcher_list *w;
  uint flags_local;
  char *path_local;
  uv_fs_event_cb cb_local;
  uv_fs_event_t *handle_local;
  
  if ((handle->flags & 4) == 0) {
    loop_00 = handle->loop;
    handle_local._4_4_ = init_inotify(loop_00);
    if (handle_local._4_4_ == 0) {
      wd_00 = inotify_add_watch(loop_00->inotify_fd,path,0xfc6);
      if (wd_00 == -1) {
        piVar1 = __errno_location();
        handle_local._4_4_ = -*piVar1;
      }
      else {
        loop = (uv_loop_t *)find_watcher(loop_00,wd_00);
        if (loop == (uv_loop_t *)0x0) {
          sVar2 = strlen(path);
          loop = (uv_loop_t *)uv__malloc(sVar2 + 0x49);
          if (loop == (uv_loop_t *)0x0) {
            return -0xc;
          }
          loop->backend_fd = wd_00;
          memcpy(&loop->pending_queue,path,sVar2 + 1);
          loop->flags = (unsigned_long)&loop->pending_queue;
          uv__queue_init((uv__queue *)&loop->active_reqs);
          loop->stop_flag = 0;
          head = uv__inotify_watchers(loop_00);
          watcher_root_RB_INSERT(head,(watcher_list *)loop);
        }
        if (((handle->flags & 4) == 0) &&
           (handle->flags = handle->flags | 4, (handle->flags & 8) != 0)) {
          handle->loop->active_handles = handle->loop->active_handles + 1;
        }
        uv__queue_insert_tail((uv__queue *)&loop->active_reqs,&handle->watchers);
        handle->path = (char *)loop->flags;
        handle->cb = cb;
        handle->wd = wd_00;
        handle_local._4_4_ = 0;
      }
    }
  }
  else {
    handle_local._4_4_ = -0x16;
  }
  return handle_local._4_4_;
}

Assistant:

int uv_fs_event_start(uv_fs_event_t* handle,
                      uv_fs_event_cb cb,
                      const char* path,
                      unsigned int flags) {
  struct watcher_list* w;
  uv_loop_t* loop;
  size_t len;
  int events;
  int err;
  int wd;

  if (uv__is_active(handle))
    return UV_EINVAL;

  loop = handle->loop;

  err = init_inotify(loop);
  if (err)
    return err;

  events = IN_ATTRIB
         | IN_CREATE
         | IN_MODIFY
         | IN_DELETE
         | IN_DELETE_SELF
         | IN_MOVE_SELF
         | IN_MOVED_FROM
         | IN_MOVED_TO;

  wd = inotify_add_watch(loop->inotify_fd, path, events);
  if (wd == -1)
    return UV__ERR(errno);

  w = find_watcher(loop, wd);
  if (w)
    goto no_insert;

  len = strlen(path) + 1;
  w = uv__malloc(sizeof(*w) + len);
  if (w == NULL)
    return UV_ENOMEM;

  w->wd = wd;
  w->path = memcpy(w + 1, path, len);
  uv__queue_init(&w->watchers);
  w->iterating = 0;
  RB_INSERT(watcher_root, uv__inotify_watchers(loop), w);

no_insert:
  uv__handle_start(handle);
  uv__queue_insert_tail(&w->watchers, &handle->watchers);
  handle->path = w->path;
  handle->cb = cb;
  handle->wd = wd;

  return 0;
}